

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O2

void __thiscall
google::
sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
::sparse_hashtable(sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                   *this,sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                         *ht,size_type min_buckets_wanted)

{
  undefined8 uVar1;
  size_type sVar2;
  size_type sVar3;
  float fVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  undefined1 uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_38;
  
  iVar10 = (ht->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher.
           id_;
  iVar11 = (ht->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher.
           num_hashes_;
  uVar1 = *(undefined8 *)
           &(ht->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher.
            num_compares_;
  sVar2 = (ht->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
          enlarge_threshold_;
  sVar3 = (ht->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
          shrink_threshold_;
  fVar4 = (ht->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.shrink_factor_;
  bVar5 = (ht->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.consider_shrink_
  ;
  bVar6 = (ht->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.use_empty_;
  bVar7 = (ht->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.use_deleted_;
  uVar8 = (ht->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.field_0x2b;
  uVar9 = (ht->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.num_ht_copies_;
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.enlarge_factor_ =
       (ht->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.enlarge_factor_;
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.shrink_factor_ = fVar4
  ;
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.consider_shrink_ =
       bVar5;
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.use_empty_ = bVar6;
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.use_deleted_ = bVar7;
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.field_0x2b = uVar8;
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.num_ht_copies_ = uVar9
  ;
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.enlarge_threshold_ =
       sVar2;
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.shrink_threshold_ =
       sVar3;
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher.id_ =
       iVar10;
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher.
  num_hashes_ = iVar11;
  *(undefined8 *)
   &(this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher.
    num_compares_ = uVar1;
  iVar10 = (ht->key_info).super_Hasher.num_hashes_;
  uVar1 = *(undefined8 *)&(ht->key_info).super_Hasher.num_compares_;
  (this->key_info).super_Hasher.id_ = (ht->key_info).super_Hasher.id_;
  (this->key_info).super_Hasher.num_hashes_ = iVar10;
  *(undefined8 *)&(this->key_info).super_Hasher.num_compares_ = uVar1;
  this->num_deleted = 0;
  local_38.id_ = (ht->table).settings.super_allocator_type.id_;
  local_38._4_4_ = *(undefined4 *)&(ht->table).settings.super_allocator_type.field_0x4;
  local_38.count_ = (ht->table).settings.super_allocator_type.count_;
  sparsetable<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::
  sparsetable(&this->table,0,&local_38);
  sparsehash_internal::sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>::reset_thresholds
            ((sh_hashtable_settings<int,_Hasher,_unsigned_long,_4> *)this,
             (this->table).settings.table_size);
  copy_from(this,ht,min_buckets_wanted);
  return;
}

Assistant:

sparse_hashtable(const sparse_hashtable& ht,
                   size_type min_buckets_wanted = HT_DEFAULT_STARTING_BUCKETS)
      : settings(ht.settings),
        key_info(ht.key_info),
        num_deleted(0),
        table(0, ht.get_allocator()) {
    settings.reset_thresholds(bucket_count());
    copy_from(ht, min_buckets_wanted);  // copy_from() ignores deleted entries
  }